

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedCompanion.cc
# Opt level: O2

bool __thiscall Glucose::SharedCompanion::addSolver(SharedCompanion *this,ParallelSolver *s)

{
  pthread_mutex_t *__mutex;
  int local_14;
  ParallelSolver *s_local;
  
  s_local = s;
  vec<Glucose::ParallelSolver_*>::push((vec<Glucose::ParallelSolver_*> *)this,&s_local);
  __mutex = (pthread_mutex_t *)malloc(0x28);
  pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
  local_14 = 0;
  vec<int>::push(&this->nextUnit,&local_14);
  return true;
}

Assistant:

bool SharedCompanion::addSolver(ParallelSolver* s) {
	watchedSolvers.push(s);
	pthread_mutex_t* mu = (pthread_mutex_t*)malloc(sizeof(pthread_mutex_t));
	pthread_mutex_init(mu,NULL);
	assert(s->thn == watchedSolvers.size()-1); // all solvers must have been registered in the good order
	nextUnit.push(0);

	return true;
}